

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_ptr.h
# Opt level: O1

copy_ptr<cppcms::form::iterator::_data> * __thiscall
booster::copy_ptr<cppcms::form::iterator::_data>::operator=
          (copy_ptr<cppcms::form::iterator::_data> *this,
          copy_ptr<cppcms::form::iterator::_data> *other)

{
  _data *p_Var1;
  _data *tmp;
  _data *p_Var2;
  
  if (this != other) {
    if (other->ptr_ == (_data *)0x0) {
      p_Var2 = (_data *)0x0;
    }
    else {
      p_Var2 = (_data *)operator_new(1);
    }
    p_Var1 = this->ptr_;
    this->ptr_ = p_Var2;
    if (p_Var1 != (_data *)0x0) {
      operator_delete(p_Var1);
    }
  }
  return this;
}

Assistant:

copy_ptr const &operator=(copy_ptr const &other)
		{
			if(this != &other) {
				copy_ptr tmp(other);
				swap(tmp);
			}
			return *this;
		}